

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

LabelInstr * __thiscall IR::Instr::GetOrCreateContinueLabel(Instr *this,bool isHelper)

{
  IRKind IVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  LabelInstr *pLVar5;
  
  pLVar5 = (LabelInstr *)this->m_next;
  if ((pLVar5 == (LabelInstr *)0x0) ||
     (((IVar1 = (pLVar5->super_Instr).m_kind, IVar1 != InstrKindProfiledLabel &&
       (IVar1 != InstrKindLabel)) || (((pLVar5->field_0x78 & 2) == 0) == isHelper)))) {
    pLVar5 = LabelInstr::New(Label,this->m_func,isHelper);
    InsertAfter(this,&pLVar5->super_Instr);
    return pLVar5;
  }
  if (IVar1 == InstrKindLabel) {
    return pLVar5;
  }
  if (IVar1 == InstrKindProfiledLabel) {
    return pLVar5;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                     ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
  if (bVar3) {
    *puVar4 = 0;
    return pLVar5;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

IR::LabelInstr *
Instr::GetOrCreateContinueLabel(const bool isHelper)
{
    if (m_next && m_next->IsLabelInstr() && m_next->AsLabelInstr()->isOpHelper == isHelper)
    {
        return m_next->AsLabelInstr();
    }

    IR::LabelInstr *const label = IR::LabelInstr::New(Js::OpCode::Label, m_func, isHelper);
    InsertAfter(label);
    return label;
}